

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteUInt32
               (int field_number,uint32_t value,CodedOutputStream *output)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = (ulong)value;
  uVar4 = field_number << 3;
  pbVar2 = output->cur_;
  if ((output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar2);
  }
  uVar5 = uVar4;
  if (0x7f < uVar4) {
    do {
      *pbVar2 = (byte)uVar5 | 0x80;
      uVar4 = uVar5 >> 7;
      pbVar2 = pbVar2 + 1;
      bVar1 = 0x3fff < uVar5;
      uVar5 = uVar4;
    } while (bVar1);
  }
  *pbVar2 = (byte)uVar4;
  pbVar2 = pbVar2 + 1;
  output->cur_ = pbVar2;
  if ((output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar2);
  }
  if (0x7f < value) {
    do {
      uVar4 = (uint)uVar3;
      *pbVar2 = (byte)uVar3 | 0x80;
      uVar3 = uVar3 >> 7;
      pbVar2 = pbVar2 + 1;
    } while (0x3fff < uVar4);
  }
  *pbVar2 = (byte)uVar3;
  output->cur_ = pbVar2 + 1;
  return;
}

Assistant:

void WireFormatLite::WriteUInt32(int field_number, uint32_t value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteUInt32NoTag(value, output);
}